

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O0

void CheckFinite(MeshGL *mesh)

{
  bool bVar1;
  reference pfVar2;
  char *pcVar3;
  char *in_R9;
  string local_160;
  AssertHelper local_140;
  Message local_138;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__2;
  const_iterator cStack_110;
  float v_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<float,_std::allocator<float>_> *__range1_2;
  AssertHelper local_d8;
  Message local_d0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar__1;
  const_iterator cStack_a8;
  float v_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<float,_std::allocator<float>_> *__range1_1;
  string local_88;
  AssertHelper local_68;
  Message local_60 [3];
  bool local_41;
  undefined1 local_40 [8];
  AssertionResult gtest_ar_;
  const_iterator cStack_28;
  float v;
  const_iterator __end1;
  const_iterator __begin1;
  vector<float,_std::allocator<float>_> *__range1;
  MeshGL *mesh_local;
  
  __end1 = std::vector<float,_std::allocator<float>_>::begin(&mesh->vertProperties);
  cStack_28 = std::vector<float,_std::allocator<float>_>::end(&mesh->vertProperties);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd8);
    if (!bVar1) {
      __end1_1 = std::vector<float,_std::allocator<float>_>::begin(&mesh->runTransform);
      cStack_a8 = std::vector<float,_std::allocator<float>_>::end(&mesh->runTransform);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=(&__end1_1,&stack0xffffffffffffff58);
        if (!bVar1) {
          __end1_2 = std::vector<float,_std::allocator<float>_>::begin(&mesh->halfedgeTangent);
          cStack_110 = std::vector<float,_std::allocator<float>_>::end(&mesh->halfedgeTangent);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=(&__end1_2,&stack0xfffffffffffffef0);
            if (!bVar1) {
              return;
            }
            pfVar2 = __gnu_cxx::
                     __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
                     operator*(&__end1_2);
            gtest_ar__2.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ = *pfVar2;
            local_129 = std::isfinite(gtest_ar__2.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_4_);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_128,&local_129,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
            if (!bVar1) {
              testing::Message::Message(&local_138);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_160,(internal *)local_128,(AssertionResult *)"std::isfinite(v)",
                         "false","true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_140,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/test_main.cpp"
                         ,0x12a,pcVar3);
              testing::internal::AssertHelper::operator=(&local_140,&local_138);
              testing::internal::AssertHelper::~AssertHelper(&local_140);
              std::__cxx11::string::~string((string *)&local_160);
              testing::Message::~Message(&local_138);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
            if (!bVar1) break;
            __gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
            ::operator++(&__end1_2);
          }
          return;
        }
        pfVar2 = __gnu_cxx::
                 __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
                 operator*(&__end1_1);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = *pfVar2;
        local_c1 = std::isfinite(gtest_ar__1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._4_4_);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_c0,&local_c1,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
        if (!bVar1) {
          testing::Message::Message(&local_d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&__range1_2,(internal *)local_c0,
                     (AssertionResult *)"std::isfinite(v)","false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_d8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/test_main.cpp"
                     ,0x127,pcVar3);
          testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
          testing::internal::AssertHelper::~AssertHelper(&local_d8);
          std::__cxx11::string::~string((string *)&__range1_2);
          testing::Message::~Message(&local_d0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
        if (!bVar1) break;
        __gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
        operator++(&__end1_1);
      }
      return;
    }
    pfVar2 = __gnu_cxx::
             __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&__end1);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = *pfVar2;
    local_41 = std::isfinite(gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_40,&local_41,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
    if (!bVar1) {
      testing::Message::Message(local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_88,(internal *)local_40,(AssertionResult *)"std::isfinite(v)","false","true"
                 ,in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/test_main.cpp"
                 ,0x124,pcVar3);
      testing::internal::AssertHelper::operator=(&local_68,local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      testing::Message::~Message(local_60);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void CheckFinite(const MeshGL& mesh) {
  for (float v : mesh.vertProperties) {
    ASSERT_TRUE(std::isfinite(v));
  }
  for (float v : mesh.runTransform) {
    ASSERT_TRUE(std::isfinite(v));
  }
  for (float v : mesh.halfedgeTangent) {
    ASSERT_TRUE(std::isfinite(v));
  }
}